

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.h
# Opt level: O1

void __thiscall nesvis::Gui::~Gui(Gui *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->memory_widget).ppu_mem_lables_._M_t);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->memory_widget).cpu_mem_labels_._M_t);
  pcVar2 = (this->memory_widget).goto_address_input_._M_dataplus._M_p;
  paVar1 = &(this->memory_widget).goto_address_input_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  lVar3 = 0x5018;
  do {
    sf::Texture::~Texture
              ((Texture *)
               ((long)&(this->log_widget).text_list_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != 0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return;
}

Assistant:

Gui(n_e_s::nes::Nes *nes, PpuHelper *ppu_helper, Control *control)
            : log_widget(),
              cpu_widget(nes, control),
              ppu_widget(nes, ppu_helper),
              memory_widget(nes) {}